

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* anon_unknown.dwarf_196f0::getIDLBase
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,Type *type,IDLExport *exporter,string *field_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type sVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  undefined8 uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  IDLTypeIdentifierVisitor visitor;
  string type_name;
  string local_160;
  string local_140;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  ulong *local_100;
  long local_f8;
  ulong local_f0 [2];
  string local_e0;
  undefined **local_c0;
  IDLExport *local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_c0 = &PTR_visit__0011d820;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  local_b8 = exporter;
  Typelib::Type::getNamespace_abi_cxx11_();
  getIDLAbsoluteNamespace(&local_160,&local_140,local_b8);
  std::__cxx11::string::operator=((string *)&local_70,(string *)&local_160);
  paVar3 = &local_160.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar3) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  paVar4 = &local_140.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar4) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  Typelib::TypeVisitor::apply((Type *)&local_c0);
  normalizeIDLName(&local_160,&local_b0);
  std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar3) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  local_160._M_dataplus._M_p = (pointer)paVar3;
  if (field_name->_M_string_length == 0) {
    std::__cxx11::string::_M_construct<char*>((string *)&local_160,local_70,local_70 + local_68);
    std::operator+(&local_140,&local_b0,&local_90);
    paVar1 = &(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p == paVar3) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,local_160.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_160.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->first)._M_dataplus._M_p = local_160._M_dataplus._M_p;
      (__return_storage_ptr__->first).field_2._M_allocated_capacity =
           CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,local_160.field_2._M_local_buf[0])
      ;
    }
    (__return_storage_ptr__->first)._M_string_length = local_160._M_string_length;
    local_160._M_string_length = 0;
    local_160.field_2._M_local_buf[0] = '\0';
    paVar1 = &(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p == paVar4) {
      paVar1->_M_allocated_capacity = local_140.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_140.field_2._8_8_
      ;
    }
    else {
      (__return_storage_ptr__->second)._M_dataplus._M_p = local_140._M_dataplus._M_p;
      (__return_storage_ptr__->second).field_2._M_allocated_capacity =
           local_140.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->second)._M_string_length = local_140._M_string_length;
    local_160._M_dataplus._M_p = (pointer)paVar3;
    goto LAB_0010fbcc;
  }
  std::__cxx11::string::_M_construct<char*>((string *)&local_160,local_70,local_70 + local_68);
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  std::__cxx11::string::append((char *)&local_100);
  stripLeadingUnderscore(&local_e0,field_name);
  uVar9 = 0xf;
  if (local_100 != local_f0) {
    uVar9 = local_f0[0];
  }
  if (uVar9 < local_e0._M_string_length + local_f8) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      uVar10 = local_e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_e0._M_string_length + local_f8) goto LAB_0010f992;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_100);
  }
  else {
LAB_0010f992:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_e0._M_dataplus._M_p);
  }
  local_120 = &local_110;
  puVar2 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar2) {
    local_110 = *puVar2;
    uStack_108 = puVar6[3];
  }
  else {
    local_110 = *puVar2;
    local_120 = (undefined8 *)*puVar6;
  }
  local_118 = puVar6[1];
  *puVar6 = puVar2;
  puVar6[1] = 0;
  *(undefined1 *)puVar2 = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_120,(ulong)local_90._M_dataplus._M_p);
  puVar8 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_140.field_2._M_allocated_capacity = *puVar8;
    local_140.field_2._8_8_ = plVar7[3];
    local_140._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_140.field_2._M_allocated_capacity = *puVar8;
    local_140._M_dataplus._M_p = (pointer)*plVar7;
  }
  sVar5 = plVar7[1];
  *plVar7 = (long)puVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  paVar1 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p == paVar3) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,local_160.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_160.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p = local_160._M_dataplus._M_p;
    (__return_storage_ptr__->first).field_2._M_allocated_capacity =
         CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,local_160.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->first)._M_string_length = local_160._M_string_length;
  local_160._M_string_length = 0;
  local_160.field_2._M_local_buf[0] = '\0';
  paVar1 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p == paVar4) {
    paVar1->_M_allocated_capacity = local_140.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_140.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->second)._M_dataplus._M_p = local_140._M_dataplus._M_p;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity =
         local_140.field_2._M_allocated_capacity;
  }
  (__return_storage_ptr__->second)._M_string_length = sVar5;
  local_140._M_string_length = 0;
  local_140.field_2._M_allocated_capacity =
       local_140.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_160._M_dataplus._M_p = (pointer)paVar3;
  local_140._M_dataplus._M_p = (pointer)paVar4;
  if (local_120 != &local_110) {
    operator_delete(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100);
  }
LAB_0010fbcc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar3) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  local_c0 = &PTR_visit__0011d820;
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

static pair<string, string> getIDLBase(Type const& type, IDLExport const& exporter,
                                           std::string const& field_name = std::string())
    {
        std::string type_name;
        IDLTypeIdentifierVisitor visitor(exporter);

        visitor.apply(type);
        if (field_name.empty()) {
            return make_pair(visitor.getTargetNamespace(),
                             visitor.m_front + visitor.m_back);
        } else {
            return make_pair(visitor.getTargetNamespace(),
                             visitor.m_front + " " + stripLeadingUnderscore(field_name) +
                             visitor.m_back);
        }
    }